

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnector.cpp
# Opt level: O0

int __thiscall
FIX::SocketConnector::connect(SocketConnector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socket_handle s;
  ulong uVar1;
  char *pcVar2;
  int in_R8D;
  int in_R9D;
  int in_stack_00000010;
  socket_handle socket;
  int rcvBufSize_local;
  int sendBufSize_local;
  bool noDelay_local;
  int port_local;
  string *address_local;
  SocketConnector *this_local;
  
  s = socket_createConnector();
  if (s != -1) {
    if ((__len & 1) != 0) {
      socket_setsockopt(s,1);
    }
    if (in_R8D != 0) {
      socket_setsockopt(s,7,in_R8D);
    }
    if (in_R9D != 0) {
      socket_setsockopt(s,8,in_R9D);
    }
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) || (in_stack_00000010 != 0)) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      socket_bind(s,pcVar2,in_stack_00000010);
    }
    SocketMonitor::addConnect(&this->m_monitor,s);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    socket_connect(s,pcVar2,(int)__addr);
  }
  return s;
}

Assistant:

socket_handle SocketConnector::connect(
    const std::string &address,
    int port,
    bool noDelay,
    int sendBufSize,
    int rcvBufSize,
    const std::string &sourceAddress,
    int sourcePort) {
  socket_handle socket = socket_createConnector();

  if (socket != INVALID_SOCKET_HANDLE) {
    if (noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, sendBufSize);
    }
    if (rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, rcvBufSize);
    }
    if (!sourceAddress.empty() || sourcePort) {
      socket_bind(socket, sourceAddress.c_str(), sourcePort);
    }
    m_monitor.addConnect(socket);
    socket_connect(socket, address.c_str(), port);
  }
  return socket;
}